

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_start(SASL *sasl,connectdata *conn,_Bool force_ir,saslprogress *progress)

{
  SessionHandle *data;
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  CURLcode CVar5;
  saslstate sVar6;
  size_t sVar7;
  saslstate sVar8;
  char *__s;
  char *resp;
  size_t len;
  char *local_50;
  size_t local_48;
  saslstate local_40;
  saslstate local_3c;
  saslprogress *local_38;
  
  data = conn->data;
  local_50 = (char *)0x0;
  local_48 = 0;
  sasl->force_ir = force_ir;
  sasl->authused = 0;
  uVar4 = sasl->prefmech & sasl->authmechs;
  *progress = SASL_IDLE;
  if (((uVar4 & 0x20) != 0) && (*conn->passwd == '\0')) {
    sasl->authused = 0x20;
    if ((force_ir) || ((data->set).sasl_ir == true)) {
      CVar5 = sasl_create_login_message(data,conn->user,&local_50,&local_48);
      sVar8 = SASL_FINAL;
      sVar6 = SASL_EXTERNAL;
      __s = "EXTERNAL";
      goto LAB_004a757f;
    }
    sVar8 = SASL_FINAL;
    sVar6 = SASL_EXTERNAL;
    __s = "EXTERNAL";
    goto LAB_004a757c;
  }
  sVar8 = SASL_FINAL;
  bVar2 = true;
  if ((conn->bits).user_passwd != true) {
LAB_004a7596:
    CVar5 = CURLE_OK;
    __s = (char *)0x0;
    sVar6 = SASL_STOP;
    goto LAB_004a759a;
  }
  if ((uVar4 & 8) == 0) {
    if ((uVar4 & 4) != 0) {
      sasl->authused = 4;
      sVar6 = SASL_CRAMMD5;
      __s = "CRAM-MD5";
      goto LAB_004a757c;
    }
    if (((char)uVar4 < '\0') || (conn->xoauth2_bearer != (char *)0x0)) {
      sasl->authused = 0x80;
      if ((!force_ir) && ((data->set).sasl_ir != true)) {
        sVar6 = SASL_XOAUTH2;
        __s = "XOAUTH2";
        goto LAB_004a757c;
      }
      CVar5 = sasl_create_xoauth2_message(data,conn->user,conn->xoauth2_bearer,&local_50,&local_48);
      sVar8 = SASL_FINAL;
      sVar6 = SASL_XOAUTH2;
      __s = "XOAUTH2";
    }
    else if ((uVar4 & 1) == 0) {
      if ((uVar4 & 2) == 0) goto LAB_004a7596;
      sasl->authused = 2;
      if ((!force_ir) && ((data->set).sasl_ir != true)) {
        sVar6 = SASL_PLAIN;
        __s = "PLAIN";
        goto LAB_004a757c;
      }
      CVar5 = sasl_create_plain_message(data,conn->user,conn->passwd,&local_50,&local_48);
      sVar8 = SASL_FINAL;
      sVar6 = SASL_PLAIN;
      __s = "PLAIN";
    }
    else {
      sasl->authused = 1;
      if ((!force_ir) && ((data->set).sasl_ir != true)) {
        sVar8 = SASL_LOGIN_PASSWD;
        sVar6 = SASL_LOGIN;
        __s = "LOGIN";
        goto LAB_004a757c;
      }
      CVar5 = sasl_create_login_message(data,conn->user,&local_50,&local_48);
      sVar8 = SASL_LOGIN_PASSWD;
      sVar6 = SASL_LOGIN;
      __s = "LOGIN";
    }
  }
  else {
    sasl->authused = 8;
    sVar6 = SASL_DIGESTMD5;
    __s = "DIGEST-MD5";
LAB_004a757c:
    CVar5 = CURLE_OK;
  }
LAB_004a757f:
  bVar2 = false;
LAB_004a759a:
  pcVar3 = local_50;
  if (CVar5 == CURLE_OK) {
    local_3c = sVar6;
    local_38 = progress;
    if (((local_50 != (char *)0x0) && (uVar1 = sasl->params->maxirlen, uVar1 != 0)) &&
       (local_40 = sVar8, sVar7 = strlen(__s), sVar8 = local_40, uVar1 < sVar7 + local_48)) {
      (*Curl_cfree)(pcVar3);
      local_50 = (char *)0x0;
      sVar8 = local_40;
    }
    CVar5 = CURLE_OK;
    if ((!bVar2) && (CVar5 = (*sasl->params->sendauth)(conn,__s,local_50), CVar5 == CURLE_OK)) {
      *local_38 = SASL_INPROGRESS;
      if (local_50 == (char *)0x0) {
        sVar8 = local_3c;
      }
      sasl->state = sVar8;
      CVar5 = CURLE_OK;
    }
  }
  (*Curl_cfree)(local_50);
  return CVar5;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct connectdata *conn,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  unsigned int enabledmechs;
  const char *mech = NULL;
  char *resp = NULL;
  size_t len = 0;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;

  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      result = sasl_create_external_message(data, conn->user, &resp, &len);
  }
  else if(conn->bits.user_passwd) {
#if defined(USE_KERBEROS5)
    if(enabledmechs & SASL_MECH_GSSAPI) {
      sasl->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      sasl->params->service,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp, &len);
    }
    else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(enabledmechs & SASL_MECH_DIGEST_MD5) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if(enabledmechs & SASL_MECH_NTLM) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                     &conn->ntlm, &resp, &len);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_XOAUTH2) || conn->xoauth2_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_XOAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_xoauth2_message(data, conn->user,
                                             conn->xoauth2_bearer,
                                             &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_login_message(data, conn->user, &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_plain_message(data, conn->user, conn->passwd,
                                           &resp, &len);
    }
  }

  if(!result) {
    if(resp && sasl->params->maxirlen &&
       strlen(mech) + len > sasl->params->maxirlen) {
      free(resp);
      resp = NULL;
    }

    if(mech) {
      result = sasl->params->sendauth(conn, mech, resp);
      if(!result) {
        *progress = SASL_INPROGRESS;
        state(sasl, conn, resp? state2: state1);
      }
    }
  }

  free(resp);

  return result;
}